

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

secp256k1_context * secp256k1_context_create(uint flags)

{
  int *__src;
  secp256k1_context *psVar1;
  secp256k1_context *psVar2;
  void *in_RSI;
  
  __src = (int *)secp256k1_context_preallocated_size(flags);
  psVar1 = (secp256k1_context *)malloc((size_t)__src);
  if (psVar1 != (secp256k1_context *)0x0) {
    psVar2 = secp256k1_context_preallocated_create(psVar1,flags);
    if (psVar2 == (secp256k1_context *)0x0) {
      free(psVar1);
      psVar1 = (secp256k1_context *)0x0;
    }
    return psVar1;
  }
  secp256k1_context_create_cold_1();
  if (__src == (int *)0x0) {
    secp256k1_context_preallocated_clone_cold_3();
  }
  else if (in_RSI != (void *)0x0) {
    if (*__src == 0) {
      secp256k1_context_preallocated_clone_cold_1();
      return (secp256k1_context *)0x0;
    }
    psVar1 = (secp256k1_context *)memcpy(in_RSI,__src,200);
    return psVar1;
  }
  secp256k1_context_preallocated_clone_cold_2();
  return (secp256k1_context *)0x0;
}

Assistant:

secp256k1_context* secp256k1_context_create(unsigned int flags) {
    size_t const prealloc_size = secp256k1_context_preallocated_size(flags);
    secp256k1_context* ctx = (secp256k1_context*)checked_malloc(&default_error_callback, prealloc_size);
    if (EXPECT(secp256k1_context_preallocated_create(ctx, flags) == NULL, 0)) {
        free(ctx);
        return NULL;
    }

    return ctx;
}